

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O3

void __thiscall FFT::ComplexData::set(ComplexData *this,Image *image)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  imageException *this_00;
  uint uVar4;
  uchar *puVar5;
  uchar *puVar6;
  kiss_fft_cpx *pkVar7;
  long lVar8;
  ulong uVar9;
  
  if ((image->_data != (uchar *)0x0) && (image->_colorCount == '\x01')) {
    if ((this->super_BaseComplexData<kiss_fft_cpx>)._data != (kiss_fft_cpx *)0x0) {
      (*(this->super_BaseComplexData<kiss_fft_cpx>)._vptr_BaseComplexData[3])(this);
      (this->super_BaseComplexData<kiss_fft_cpx>)._data = (kiss_fft_cpx *)0x0;
    }
    (this->super_BaseComplexData<kiss_fft_cpx>)._width = 0;
    (this->super_BaseComplexData<kiss_fft_cpx>)._height = 0;
    (*(this->super_BaseComplexData<kiss_fft_cpx>)._vptr_BaseComplexData[2])
              (this,(ulong)(image->_height * image->_width) << 3);
    uVar1 = image->_width;
    (this->super_BaseComplexData<kiss_fft_cpx>)._width = uVar1;
    uVar2 = image->_height;
    (this->super_BaseComplexData<kiss_fft_cpx>)._height = uVar2;
    uVar3 = image->_rowSize;
    uVar4 = uVar2 * uVar3;
    if (uVar4 != 0) {
      puVar6 = image->_data;
      pkVar7 = (this->super_BaseComplexData<kiss_fft_cpx>)._data;
      puVar5 = puVar6 + uVar4;
      do {
        if (uVar1 != 0) {
          lVar8 = 0;
          uVar9 = 0;
          do {
            lVar8 = lVar8 + -8;
            pkVar7[uVar9].r = (float)puVar6[uVar9];
            pkVar7[uVar9].i = 0.0;
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
          pkVar7 = (kiss_fft_cpx *)((long)pkVar7 - lVar8);
        }
        puVar6 = puVar6 + uVar3;
      } while (puVar6 != puVar5);
    }
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException
            (this_00,"Failed to allocate complex data for empty or coloured image");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FFTExecutor::directTransform( const ComplexData & in, ComplexData & out )
    {
        if ( _planDirect == 0 || !equalSize( *this, in ) || !equalSize( in, out ) )
            throw imageException( "Invalid parameters for FFTExecutor::directTransform()" );

        kiss_fftnd( _planDirect, in.data(), out.data() );
    }